

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadEffectFloat(ColladaParser *this,ai_real *pFloat)

{
  bool bVar1;
  int iVar2;
  char *content;
  
  do {
    while( true ) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 != 1) break;
      bVar1 = IsElement(this,"float");
      if (bVar1) {
        content = GetTextContent(this);
        content = fast_atoreal_move<float>(content,pFloat,true);
        SkipSpacesAndLineEnd<char>(&content);
        TestClosing(this,"float");
      }
      else {
        SkipElement(this);
      }
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  } while (iVar2 != 2);
  return;
}

Assistant:

void ColladaParser::ReadEffectFloat(ai_real& pFloat)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("float"))
            {
                // text content contains a single floats
                const char* content = GetTextContent();
                content = fast_atoreal_move<ai_real>(content, pFloat);
                SkipSpacesAndLineEnd(&content);

                TestClosing("float");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}